

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2MatchNumberPeculiarity(void)

{
  bool bVar1;
  string a;
  string word3;
  string word2;
  string word1;
  RE2 r;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_318;
  StringPiece local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  LogMessageFatal local_280;
  RE2 local_100;
  
  RE2::RE2(&local_100,"(foo)|(bar)|(baz)");
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2e0._M_allocated_capacity = (size_type)&local_2d0;
  local_2e0._8_8_ = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  local_2c0.field_2._M_local_buf[0] = '\0';
  local_2d0._M_local_buf[0] = '\0';
  local_280.super_LogMessage._0_8_ = "foo";
  local_280.super_LogMessage._8_4_ = 3;
  local_300._M_allocated_capacity = (size_type)&local_2a0;
  local_310.ptr_ = (char *)&local_2c0;
  local_318 = &local_2e0;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    ((StringPiece *)&local_280,&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_300._M_allocated_capacity,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_310,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_318);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x145);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(\"foo\", r, &word1, &word2, &word3)");
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  bVar1 = std::operator==(&local_2a0,"foo");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x146);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,"Check failed: (word1) == (\"foo\")"
                   );
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  bVar1 = std::operator==(&local_2c0,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x147);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,"Check failed: (word2) == (\"\")");
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_2e0,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x148);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,"Check failed: (word3) == (\"\")");
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  local_280.super_LogMessage._0_8_ = "bar";
  local_280.super_LogMessage._8_4_ = 3;
  local_318 = &local_2e0;
  local_310.ptr_ = (char *)&local_2c0;
  local_300._M_allocated_capacity = (size_type)&local_2a0;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    ((StringPiece *)&local_280,&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_300._M_allocated_capacity,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_310,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_318);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x149);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(\"bar\", r, &word1, &word2, &word3)");
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  bVar1 = std::operator==(&local_2a0,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14a);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,"Check failed: (word1) == (\"\")");
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  bVar1 = std::operator==(&local_2c0,"bar");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14b);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,"Check failed: (word2) == (\"bar\")"
                   );
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_2e0,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14c);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,"Check failed: (word3) == (\"\")");
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  local_280.super_LogMessage._0_8_ = "baz";
  local_280.super_LogMessage._8_4_ = 3;
  local_318 = &local_2e0;
  local_310.ptr_ = (char *)&local_2c0;
  local_300._M_allocated_capacity = (size_type)&local_2a0;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    ((StringPiece *)&local_280,&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_300._M_allocated_capacity,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_310,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_318);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14d);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(\"baz\", r, &word1, &word2, &word3)");
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  bVar1 = std::operator==(&local_2a0,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14e);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,"Check failed: (word1) == (\"\")");
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  bVar1 = std::operator==(&local_2c0,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x14f);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,"Check failed: (word2) == (\"\")");
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_2e0,"baz");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x150);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,"Check failed: (word3) == (\"baz\")"
                   );
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  local_280.super_LogMessage._0_8_ = "f";
  local_280.super_LogMessage._8_4_ = 1;
  local_318 = &local_2e0;
  local_310.ptr_ = (char *)&local_2c0;
  local_300._M_allocated_capacity = (size_type)&local_2a0;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,std::__cxx11::string*>
                    ((StringPiece *)&local_280,&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_300._M_allocated_capacity,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_310,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_318);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x151);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,
                    "Check failed: !RE2::PartialMatch(\"f\", r, &word1, &word2, &word3)");
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  local_300._M_allocated_capacity = (size_type)&local_2f0;
  local_300._8_8_ = 0;
  local_2f0._M_local_buf[0] = '\0';
  local_310.ptr_ = "hello";
  local_310.length_ = 5;
  RE2::RE2((RE2 *)&local_280,"(foo)|hello");
  local_318 = &local_300;
  bVar1 = RE2::FullMatch<std::__cxx11::string*>
                    (&local_310,(RE2 *)&local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_318);
  RE2::~RE2((RE2 *)&local_280);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x154);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"hello\", \"(foo)|hello\", &a)");
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_300,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x155);
    std::operator<<((ostream *)&local_280.super_LogMessage.str_,"Check failed: (a) == (\"\")");
    LogMessageFatal::~LogMessageFatal(&local_280);
  }
  std::__cxx11::string::~string((string *)local_300._M_local_buf);
  std::__cxx11::string::~string((string *)local_2e0._M_local_buf);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  RE2::~RE2(&local_100);
  return;
}

Assistant:

TEST(RE2, MatchNumberPeculiarity) {
  VLOG(1) << "TestMatchNumberPeculiarity";

  RE2 r("(foo)|(bar)|(baz)");
  string word1;
  string word2;
  string word3;

  CHECK(RE2::PartialMatch("foo", r, &word1, &word2, &word3));
  CHECK_EQ(word1, "foo");
  CHECK_EQ(word2, "");
  CHECK_EQ(word3, "");
  CHECK(RE2::PartialMatch("bar", r, &word1, &word2, &word3));
  CHECK_EQ(word1, "");
  CHECK_EQ(word2, "bar");
  CHECK_EQ(word3, "");
  CHECK(RE2::PartialMatch("baz", r, &word1, &word2, &word3));
  CHECK_EQ(word1, "");
  CHECK_EQ(word2, "");
  CHECK_EQ(word3, "baz");
  CHECK(!RE2::PartialMatch("f", r, &word1, &word2, &word3));

  string a;
  CHECK(RE2::FullMatch("hello", "(foo)|hello", &a));
  CHECK_EQ(a, "");
}